

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O0

iuParamGenerator<int>_conflict __thiscall
iutest::Range<int>(iutest *this,int begin,int end,int step)

{
  iuRangeParamsGenerator<int> *this_00;
  _Interface *extraout_RDX;
  iuParamGenerator<int>_conflict iVar1;
  int step_local;
  int end_local;
  int begin_local;
  
  this_00 = (iuRangeParamsGenerator<int> *)operator_new(0x18);
  detail::iuRangeParamsGenerator<int>::iuRangeParamsGenerator(this_00,begin,end,step);
  detail::iuParamGenerator<int>::iuParamGenerator
            ((iuParamGenerator<int> *)this,(_Interface *)this_00);
  iVar1.m_pInterface = extraout_RDX;
  iVar1.super_iuIParamGenerator<std::tuple<bool,_int,_int>_>._vptr_iuIParamGenerator =
       (_func_int **)this;
  return iVar1;
}

Assistant:

detail::iuParamGenerator<T> IUTEST_ATTRIBUTE_UNUSED_ Range(T begin, T end, T step=static_cast<T>(1))
{
    return new detail::iuRangeParamsGenerator<T>(begin, end, step);
}